

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpauseanimation.cpp
# Opt level: O2

void __thiscall QPauseAnimation::QPauseAnimation(QPauseAnimation *this,int msecs,QObject *parent)

{
  QPauseAnimationPrivate *this_00;
  
  this_00 = (QPauseAnimationPrivate *)operator_new(0xa8);
  QPauseAnimationPrivate::QPauseAnimationPrivate(this_00);
  QAbstractAnimation::QAbstractAnimation
            ((QAbstractAnimation *)this,(QAbstractAnimationPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_00668408;
  setDuration(this,msecs);
  return;
}

Assistant:

QPauseAnimation::QPauseAnimation(int msecs, QObject *parent) : QAbstractAnimation(*new QPauseAnimationPrivate, parent)
{
    setDuration(msecs);
}